

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

bool __thiscall
cbtDbvt::update(cbtDbvt *this,cbtDbvtNode *leaf,cbtDbvtVolume *volume,cbtVector3 *velocity,
               cbtScalar margin)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  cbtVector3 local_38;
  
  bVar2 = cbtDbvtAabbMm::Contain(&leaf->volume,volume);
  if (!bVar2) {
    auVar1._4_4_ = in_XMM0_Db;
    auVar1._0_4_ = margin;
    auVar1._8_4_ = in_XMM0_Dc;
    auVar1._12_4_ = in_XMM0_Dd;
    local_38.m_floats = (cbtScalar  [4])vpshufb_avx(auVar1,_DAT_00f5c6f0);
    cbtDbvtAabbMm::Expand(volume,&local_38);
    cbtDbvtAabbMm::SignedExpand(volume,velocity);
    update(this,leaf,volume);
  }
  return !bVar2;
}

Assistant:

bool cbtDbvt::update(cbtDbvtNode* leaf, cbtDbvtVolume& volume, const cbtVector3& velocity, cbtScalar margin)
{
	if (leaf->volume.Contain(volume)) return (false);
	volume.Expand(cbtVector3(margin, margin, margin));
	volume.SignedExpand(velocity);
	update(leaf, volume);
	return (true);
}